

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_>::NewKey
          (TMap<FName,_int,_THashTraits<FName>,_TValueTraits<int>_> *this,FName *key)

{
  IPair IVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  uint uVar5;
  Node *pNVar6;
  Node *pNVar7;
  uint uVar8;
  uint uVar9;
  FName local_14;
  
  uVar5 = key->Index;
  pNVar4 = this->Nodes;
  uVar8 = this->Size - 1;
  uVar9 = uVar8 & uVar5;
  pNVar2 = pNVar4 + uVar9;
  pNVar3 = pNVar4[uVar9].Next;
  if (pNVar3 != (Node *)0x1) {
    pNVar7 = this->LastFree;
    do {
      pNVar6 = pNVar7;
      pNVar7 = pNVar6 + -1;
      if (pNVar6 <= pNVar4) {
        this->LastFree = pNVar7;
        Resize(this,this->Size * 2);
        pNVar2 = NewKey(this,&local_14);
        return pNVar2;
      }
    } while (pNVar7->Next != (Node *)0x1);
    this->LastFree = pNVar7;
    uVar8 = uVar8 & (pNVar2->Pair).Key.Index;
    if (uVar8 == uVar9) {
      pNVar7->Next = pNVar3;
      pNVar4 = pNVar7;
      goto LAB_0033537e;
    }
    pNVar4 = pNVar4 + uVar8;
    do {
      pNVar3 = pNVar4;
      pNVar4 = pNVar3->Next;
    } while (pNVar4 != pNVar2);
    pNVar3->Next = pNVar7;
    IVar1 = pNVar2->Pair;
    pNVar7->Next = pNVar2->Next;
    pNVar6[-1].Pair = IVar1;
    uVar5 = key->Index;
  }
  pNVar7 = (Node *)0x0;
  pNVar4 = pNVar2;
LAB_0033537e:
  pNVar2->Next = pNVar7;
  this->NumUsed = this->NumUsed + 1;
  (pNVar4->Pair).Key.Index = uVar5;
  return pNVar4;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}